

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O3

void __thiscall fmt::v8::detail::bigint::assign(bigint *this,uint64_t n)

{
  uint *puVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  
  puVar1 = (this->bigits_).super_buffer<unsigned_int>.ptr_;
  uVar4 = 0;
  do {
    uVar3 = uVar4;
    puVar1[uVar3] = (uint)n;
    uVar4 = uVar3 + 1;
    n = n >> 0x20;
  } while (n != 0);
  uVar2 = (this->bigits_).super_buffer<unsigned_int>.capacity_;
  if (uVar2 <= uVar3) {
    (**(this->bigits_).super_buffer<unsigned_int>._vptr_buffer)(this,uVar4);
    uVar2 = (this->bigits_).super_buffer<unsigned_int>.capacity_;
  }
  if (uVar2 < uVar4) {
    uVar4 = uVar2;
  }
  (this->bigits_).super_buffer<unsigned_int>.size_ = uVar4;
  this->exp_ = 0;
  return;
}

Assistant:

FMT_CONSTEXPR20 void assign(uint64_t n) {
    size_t num_bigits = 0;
    do {
      bigits_[num_bigits++] = n & ~bigit(0);
      n >>= bigit_bits;
    } while (n != 0);
    bigits_.resize(num_bigits);
    exp_ = 0;
  }